

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::update_v_scrollbar(Fl_Text_Display *this)

{
  Fl_Slider::scrollvalue
            (&this->mVScrollBar->super_Fl_Slider,this->mTopLineNum,this->mNVisibleLines,1,
             this->mNBufferLines + 2);
  *(undefined4 *)&(this->mVScrollBar->super_Fl_Slider).field_0xac = 3;
  return;
}

Assistant:

void Fl_Text_Display::update_v_scrollbar() {
  /* The vertical scrollbar value and slider size directly represent the top
   line number, and the number of visible lines respectively.  The scroll
   bar maximum value is chosen to generally represent the size of the whole
   buffer, with minor adjustments to keep the scrollbar widget happy */
#ifdef DEBUG
  printf("Fl_Text_Display::update_v_scrollbar():\n"
         "    mTopLineNum=%d, mNVisibleLines=%d, mNBufferLines=%d\n",
	 mTopLineNum, mNVisibleLines, mNBufferLines);
#endif // DEBUG

  mVScrollBar->value(mTopLineNum, mNVisibleLines, 1, mNBufferLines+2);
  mVScrollBar->linesize(3);
}